

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O0

void __thiscall
SAUF<UFPC>::PerformLabelingMem
          (SAUF<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  uint uVar4;
  uchar *puVar5;
  int *piVar6;
  uint *puVar7;
  reference pvVar8;
  double dVar9;
  Mat_<int> local_2c0;
  allocator<unsigned_long> local_259;
  value_type_conflict2 local_258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_250;
  int local_238;
  int local_234;
  int c_1;
  int r_1;
  int c;
  int r;
  undefined1 local_220 [8];
  MemMat<int> img_labels;
  Mat_<unsigned_char> local_148;
  undefined1 local_e8 [8];
  MemMat<unsigned_char> img;
  int w;
  int h;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  SAUF<UFPC> *this_local;
  
  img.accesses_._92_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  img.accesses_._88_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  UFPC::MemAlloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) * ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1)
                 + 1);
  cv::Mat_<unsigned_char>::Mat_(&local_148,(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_e8,&local_148);
  cv::Mat_<unsigned_char>::~Mat_(&local_148);
  cv::MatSize::operator()((MatSize *)&c);
  MemMat<int>::MemMat((MemMat<int> *)local_220,(Size *)&c,0);
  UFPC::MemSetup();
  for (r_1 = 0; r_1 < (int)img.accesses_._92_4_; r_1 = r_1 + 1) {
    for (c_1 = 0; c_1 < (int)img.accesses_._88_4_; c_1 = c_1 + 1) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
      if (*puVar5 != '\0') {
        if ((r_1 < 1) ||
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1), *puVar5 == '\0')) {
          if ((c_1 < img.accesses_._88_4_ + -1) &&
             ((0 < r_1 &&
              (puVar5 = MemMat<unsigned_char>::operator()
                                  ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 1),
              *puVar5 != '\0')))) {
            if (((c_1 < 1) || (r_1 < 1)) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
               *puVar5 == '\0')) {
              if ((c_1 < 1) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -1),
                 *puVar5 == '\0')) {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -1,c_1 + 1);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
              else {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -1);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -1,c_1 + 1);
                uVar4 = UFPC::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -1,c_1 + -1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -1,c_1 + 1);
              uVar4 = UFPC::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
          }
          else if ((c_1 < 1) ||
                  ((r_1 < 1 ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                   *puVar5 == '\0')))) {
            if ((c_1 < 1) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -1), *puVar5 == '\0'
               )) {
              uVar4 = UFPC::MemNewLabel();
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -1,c_1 + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
        }
        else {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -1,c_1);
          iVar1 = *piVar6;
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *piVar6 = iVar1;
        }
      }
    }
  }
  uVar4 = UFPC::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
  for (local_234 = 0; local_234 < (int)img.accesses_._92_4_; local_234 = local_234 + 1) {
    for (local_238 = 0; local_238 < (int)img.accesses_._88_4_; local_238 = local_238 + 1) {
      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,local_234,local_238);
      uVar4 = UFPC::MemGetLabel(*puVar7);
      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,local_234,local_238);
      *puVar7 = uVar4;
    }
  }
  local_258 = 0;
  std::allocator<unsigned_long>::allocator(&local_259);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_250,4,&local_258,&local_259);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(accesses,&local_250);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_250);
  std::allocator<unsigned_long>::~allocator(&local_259);
  dVar9 = MemMat<unsigned_char>::GetTotalAccesses((MemMat<unsigned_char> *)local_e8);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,0);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_220);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,1);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = UFPC::MemTotalAccesses();
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,2);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  MemMat<int>::GetImage(&local_2c0,(MemMat<int> *)local_220);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_2c0);
  cv::Mat_<int>::~Mat_(&local_2c0);
  UFPC::MemDealloc();
  MemMat<int>::~MemMat((MemMat<int> *)local_220);
  MemMat<unsigned_char>::~MemMat((MemMat<unsigned_char> *)local_e8);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY); // Equivalence solver

        // Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemSetup();

        // First scan

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img(r - 1 , c - 1) > 0
#define CONDITION_Q r > 0 && img(r - 1, c)>0
#define CONDITION_R c < w - 1 && r > 0 && img(r - 1,c + 1) > 0
#define CONDITION_S c > 0 && img(r,c - 1)>0
#define CONDITION_X img(r,c)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r, c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r, c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge((unsigned)img_labels(r - 1, c - 1), (unsigned)img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge((unsigned)img_labels(r, c - 1), (unsigned)img_labels(r - 1, c + 1)); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"              
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::MemFlatten();

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {
                img_labels(r, c) = LabelsSolver::MemGetLabel(img_labels(r, c));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }